

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

Gia_Man_t * Gia_ManSpeedup(Gia_Man_t *p,int Percentage,int Degree,int fVerbose,int fVeryVerbose)

{
  float tDelta_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Tim_Man_t *pTVar6;
  void *__ptr;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar9;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar10;
  char *pcVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  double local_138;
  double local_b8;
  uint *puTCEdges;
  void *pTempTim;
  uint local_70;
  int fUseLutLib;
  int nTimeCris;
  int CounterRes;
  int Counter;
  int k2;
  int k;
  int i;
  float tArrival;
  float tDelta;
  int nNodesNew;
  int iFanin2;
  int iFanin;
  int iObj;
  Vec_Int_t *vTimeFanins;
  Vec_Int_t *vTimeCries;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  int Degree_local;
  int Percentage_local;
  Gia_Man_t *p_local;
  
  bVar12 = p->pLutLib != (void *)0x0;
  puTCEdges = (uint *)0x0;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                  ,0x27e,"Gia_Man_t *Gia_ManSpeedup(Gia_Man_t *, int, int, int, int)");
  }
  if ((!bVar12) && (p->pManTime != (void *)0x0)) {
    puTCEdges = (uint *)p->pManTime;
    pTVar6 = Tim_ManDup((Tim_Man_t *)puTCEdges,1);
    p->pManTime = pTVar6;
  }
  fVar13 = Gia_ManDelayTraceLut(p);
  if (bVar12) {
    tDelta_00 = (fVar13 * (float)Percentage) / 100.0;
  }
  else {
    tDelta_00 = 1.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar13,(double)tDelta_00);
    pcVar11 = "unit-delay";
    if (bVar12) {
      pcVar11 = "LUT library";
    }
    printf("Using %s model. ",pcVar11);
    if (bVar12) {
      printf("Percentage = %d. ",(ulong)(uint)Percentage);
    }
    printf("\n");
  }
  iVar1 = Gia_ManObjNum(p);
  __ptr = calloc((long)iVar1,4);
  for (iFanin2 = 1; iVar1 = Gia_ManObjNum(p), iFanin2 < iVar1; iFanin2 = iFanin2 + 1) {
    iVar1 = Gia_ObjIsLut(p,iFanin2);
    if ((iVar1 != 0) && (fVar13 = Gia_ObjTimeSlack(p,iFanin2), fVar13 < tDelta_00)) {
      uVar2 = Gia_LutDelayTraceTCEdges(p,iFanin2,tDelta_00);
      *(uint *)((long)__ptr + (long)iFanin2 * 4) = uVar2;
    }
  }
  if (fVerbose != 0) {
    fUseLutLib = 0;
    nTimeCris = 0;
    for (iFanin2 = 1; iVar1 = Gia_ManObjNum(p), iFanin2 < iVar1; iFanin2 = iFanin2 + 1) {
      iVar1 = Gia_ObjIsLut(p,iFanin2);
      if (iVar1 != 0) {
        for (Counter = 0; iVar1 = Gia_ObjLutSize(p,iFanin2), Counter < iVar1; Counter = Counter + 1)
        {
          piVar7 = Gia_ObjLutFanins(p,iFanin2);
          iVar1 = piVar7[Counter];
          pGVar8 = Gia_ManObj(p,iVar1);
          iVar3 = Gia_ObjIsCi(pGVar8);
          if ((iVar3 == 0) && (fVar13 = Gia_ObjTimeSlack(p,iVar1), fVar13 < tDelta_00)) {
            nTimeCris = nTimeCris + 1;
          }
        }
        iVar1 = Gia_WordCountOnes(*(uint *)((long)__ptr + (long)iFanin2 * 4));
        fUseLutLib = iVar1 + fUseLutLib;
      }
    }
    uVar2 = Gia_ManLutFaninCount(p);
    if (nTimeCris == 0) {
      local_b8 = 0.0;
    }
    else {
      local_b8 = ((double)fUseLutLib * 1.0) / (double)nTimeCris;
    }
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",local_b8,
           (ulong)uVar2,(ulong)(uint)nTimeCris,(ulong)(uint)fUseLutLib);
  }
  p_00 = Gia_ManDup(p);
  Gia_ManHashStart(p_00);
  iVar1 = Gia_ManObjNum(p_00);
  iVar3 = iVar1 * 3 + 1000;
  piVar7 = (int *)calloc((long)iVar3,4);
  p_00->pNexts = piVar7;
  pGVar9 = (Gia_Rpr_t *)calloc((long)iVar3,4);
  p_00->pReprs = pGVar9;
  for (k2 = 0; k2 < iVar3; k2 = k2 + 1) {
    Gia_ObjSetRepr(p_00,k2,0xfffffff);
  }
  fUseLutLib = 0;
  nTimeCris = 0;
  p_01 = Vec_IntAlloc(0x10);
  p_02 = Vec_IntAlloc(0x10);
  iFanin2 = 1;
  do {
    iVar3 = Gia_ManObjNum(p);
    if (iVar3 <= iFanin2) {
LAB_009736e8:
      Gia_ManTimeStop(p);
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (fVerbose != 0) {
        uVar2 = Gia_ManLutNum(p);
        if (nTimeCris == 0) {
          local_138 = 0.0;
        }
        else {
          local_138 = ((double)fUseLutLib * 1.0) / (double)nTimeCris;
        }
        printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",local_138,
               (ulong)uVar2,(ulong)(uint)nTimeCris,(ulong)(uint)fUseLutLib);
      }
      if (puTCEdges != (uint *)0x0) {
        Tim_ManStop((Tim_Man_t *)p->pManTime);
        p->pManTime = puTCEdges;
      }
      pGVar10 = Gia_ManEquivToChoices(p_00,1);
      Gia_ManStop(p_00);
      return pGVar10;
    }
    iVar3 = Gia_ObjIsLut(p,iFanin2);
    if ((iVar3 != 0) && (fVar13 = Gia_ObjTimeSlack(p,iFanin2), fVar13 < tDelta_00)) {
      local_70 = 0;
      for (Counter = 0; iVar3 = Gia_ObjLutSize(p,iFanin2), Counter < iVar3; Counter = Counter + 1) {
        piVar7 = Gia_ObjLutFanins(p,iFanin2);
        pGVar8 = Gia_ManObj(p,piVar7[Counter]);
        iVar3 = Gia_ObjIsCi(pGVar8);
        if ((iVar3 == 0) &&
           ((*(uint *)((long)__ptr + (long)iFanin2 * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
          local_70 = local_70 + 1;
        }
      }
      if ((fVeryVerbose != 0) || (local_70 != 0)) {
        nTimeCris = nTimeCris + 1;
        Vec_IntClear(p_01);
        if (local_70 != 0) {
          for (Counter = 0; iVar3 = Gia_ObjLutSize(p,iFanin2), Counter < iVar3;
              Counter = Counter + 1) {
            piVar7 = Gia_ObjLutFanins(p,iFanin2);
            iVar3 = piVar7[Counter];
            pGVar8 = Gia_ManObj(p,iVar3);
            iVar5 = Gia_ObjIsCi(pGVar8);
            if ((iVar5 == 0) &&
               ((*(uint *)((long)__ptr + (long)iFanin2 * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
              for (CounterRes = 0; iVar5 = Gia_ObjLutSize(p,iVar3), CounterRes < iVar5;
                  CounterRes = CounterRes + 1) {
                piVar7 = Gia_ObjLutFanins(p,iVar3);
                if ((*(uint *)((long)__ptr + (long)iVar3 * 4) & 1 << ((byte)CounterRes & 0x1f)) != 0
                   ) {
                  Vec_IntPushUnique(p_01,piVar7[CounterRes]);
                }
              }
            }
          }
        }
        iVar3 = Vec_IntSize(p_01);
        if ((iVar3 != 0) && (iVar3 = Vec_IntSize(p_01), iVar3 <= Degree)) {
          fUseLutLib = fUseLutLib + 1;
          Vec_IntClear(p_02);
          for (Counter = 0; iVar3 = Gia_ObjLutSize(p,iFanin2), Counter < iVar3;
              Counter = Counter + 1) {
            piVar7 = Gia_ObjLutFanins(p,iFanin2);
            iVar3 = piVar7[Counter];
            pGVar8 = Gia_ManObj(p,iVar3);
            iVar5 = Gia_ObjIsCi(pGVar8);
            if (iVar5 == 0) {
              for (CounterRes = 0; iVar5 = Gia_ObjLutSize(p,iVar3), CounterRes < iVar5;
                  CounterRes = CounterRes + 1) {
                piVar7 = Gia_ObjLutFanins(p,iVar3);
                Vec_IntPushUnique(p_02,piVar7[CounterRes]);
              }
            }
            else {
              Vec_IntPushUnique(p_02,iVar3);
            }
          }
          if (fVeryVerbose != 0) {
            uVar2 = Vec_IntSize(p_01);
            uVar4 = Vec_IntSize(p_02);
            printf("%5d Node %5d : %d %2d %2d  ",(ulong)(uint)nTimeCris,(ulong)(uint)iFanin2,
                   (ulong)local_70,(ulong)uVar2,(ulong)uVar4);
            for (Counter = 0; iVar3 = Gia_ObjLutSize(p,iFanin2), Counter < iVar3;
                Counter = Counter + 1) {
              piVar7 = Gia_ObjLutFanins(p,iFanin2);
              uVar2 = piVar7[Counter];
              fVar13 = Gia_ObjTimeSlack(p,uVar2);
              pcVar11 = "";
              if ((*(uint *)((long)__ptr + (long)iFanin2 * 4) & 1 << ((byte)Counter & 0x1f)) != 0) {
                pcVar11 = "*";
              }
              printf("%d(%.2f)%s ",(double)fVar13,(ulong)uVar2,pcVar11);
            }
            printf("\n");
          }
          iVar3 = Vec_IntSize(p_01);
          if ((iVar3 != 0) && (iVar3 = Vec_IntSize(p_01), iVar3 <= Degree)) {
            iVar3 = Vec_IntSize(p_01);
            if (1 < iVar3) {
              iVar3 = Vec_IntEntry(p_01,0);
              iVar5 = Vec_IntEntry(p_01,1);
              fVar13 = Gia_ObjTimeSlack(p,iVar3);
              fVar14 = Gia_ObjTimeSlack(p,iVar5);
              if (fVar13 < fVar14) {
                Vec_IntWriteEntry(p_01,0,iVar5);
                Vec_IntWriteEntry(p_01,1,iVar3);
              }
            }
            iVar3 = Vec_IntSize(p_01);
            if (2 < iVar3) {
              iVar3 = Vec_IntEntry(p_01,1);
              iVar5 = Vec_IntEntry(p_01,2);
              fVar13 = Gia_ObjTimeSlack(p,iVar3);
              fVar14 = Gia_ObjTimeSlack(p,iVar5);
              if (fVar13 < fVar14) {
                Vec_IntWriteEntry(p_01,1,iVar5);
                Vec_IntWriteEntry(p_01,2,iVar3);
              }
              iVar3 = Vec_IntEntry(p_01,0);
              iVar5 = Vec_IntEntry(p_01,1);
              fVar13 = Gia_ObjTimeSlack(p,iVar3);
              fVar14 = Gia_ObjTimeSlack(p,iVar5);
              if (fVar13 < fVar14) {
                Vec_IntWriteEntry(p_01,0,iVar5);
                Vec_IntWriteEntry(p_01,1,iVar3);
              }
            }
            pGVar8 = Gia_ManObj(p,iFanin2);
            Gia_ManSpeedupObj(p_00,p,pGVar8,p_02,p_01);
            iVar3 = Gia_ManObjNum(p_00);
            if (iVar1 * 3 + 900 < iVar3) {
              printf("Speedup stopped adding choices because there was too many to add.\n");
              goto LAB_009736e8;
            }
          }
        }
      }
    }
    iFanin2 = iFanin2 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManSpeedup( Gia_Man_t * p, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vTimeCries, * vTimeFanins;
    int iObj, iFanin, iFanin2, nNodesNew;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    int fUseLutLib = (p->pLutLib != NULL);
    void * pTempTim = NULL;
    unsigned * puTCEdges;
    assert( Gia_ManHasMapping(p) );
    if ( !fUseLutLib && p->pManTime )
    {
        pTempTim = p->pManTime;
        p->pManTime = Tim_ManDup( (Tim_Man_t *)pTempTim, 1 );
    }
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib ? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        puTCEdges[iObj] = Gia_LutDelayTraceTCEdges( p, iObj, tDelta );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Gia_ManForEachLut( p, iObj )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && Gia_ObjTimeSlack(p, iFanin) < tDelta )
                    Counter++;
            CounterRes += Gia_WordCountOnes( puTCEdges[iObj] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Gia_ManLutFaninCount(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 );
    }

    // start the resulting network
    pNew = Gia_ManDup( p );
    Gia_ManHashStart( pNew );
    nNodesNew = 1000 + 3 * Gia_ManObjNum(pNew);
    pNew->pNexts = ABC_CALLOC( int, nNodesNew );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, nNodesNew );
    for ( i = 0; i < nNodesNew; i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_IntAlloc( 16 );
    vTimeFanins = Vec_IntAlloc( 16 );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_IntClear( vTimeCries );
        if ( nTimeCris )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                    Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                        if ( puTCEdges[iFanin] & (1<<k2) )
                            Vec_IntPushUnique( vTimeCries, iFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
        if ( (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_IntClear( vTimeFanins );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            if ( Gia_ObjIsCi(Gia_ManObj(p, iFanin)) )
                Vec_IntPushUnique( vTimeFanins, iFanin );
            else
                Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                    Vec_IntPushUnique( vTimeFanins, iFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, iObj, 
            nTimeCris, Vec_IntSize(vTimeCries), Vec_IntSize(vTimeFanins) );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            printf( "%d(%.2f)%s ", iFanin, Gia_ObjTimeSlack(p, iFanin), (puTCEdges[iObj] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_IntSize(vTimeCries) > 1 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        if ( Vec_IntSize(vTimeCries) > 2 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 1 );
            iFanin2 = Vec_IntEntry( vTimeCries, 2 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 1, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 2, iFanin );
            }
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        // add choice
        Gia_ManSpeedupObj( pNew, p, Gia_ManObj(p,iObj), vTimeFanins, vTimeCries );
        // quit if the number of nodes is large
        if ( Gia_ManObjNum(pNew) > nNodesNew - 100 )
        {
            printf( "Speedup stopped adding choices because there was too many to add.\n" );
            break;
        }
    }
    Gia_ManTimeStop( p );
    Vec_IntFree( vTimeCries );
    Vec_IntFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
        Gia_ManLutNum(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 ); 
    if ( pTempTim )
    {
        Tim_ManStop( (Tim_Man_t *)p->pManTime );
        p->pManTime = pTempTim;
    }
    // derive AIG with choices
//Gia_ManPrintStats( pNew, 0 );
    pTemp = Gia_ManEquivToChoices( pNew, 1 );
    Gia_ManStop( pNew );
//Gia_ManPrintStats( pTemp, 0 );
//    pNew = Gia_ManDupOrderDfsChoices( pTemp );
//    Gia_ManStop( pTemp );
//Gia_ManPrintStats( pNew, 0 );
//    return pNew;
    return pTemp;
}